

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void handle_close_frame(cio_websocket *websocket,uint8_t *data,uint_fast8_t length)

{
  _Bool _Var1;
  uint8_t uVar2;
  size_t length_00;
  size_t frame_length;
  uint8_t *reason;
  cio_utf8_state state;
  uint16_t status_code;
  uint_fast8_t len;
  uint8_t *puStack_18;
  uint_fast8_t length_local;
  uint8_t *data_local;
  cio_websocket *websocket_local;
  
  reason._6_1_ = length;
  reason._7_1_ = length;
  puStack_18 = data;
  if (length == '\x01') {
    handle_error(websocket,CIO_PROTOCOL_NOT_SUPPORTED,CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR,
                 "close payload of length 1");
  }
  else {
    reason._4_2_ = 1000;
    if (1 < length) {
      reason._4_2_ = *(uint16_t *)data;
      reason._4_2_ = cio_be16toh(reason._4_2_);
      _Var1 = is_invalid_status_code(reason._4_2_);
      if (_Var1) {
        handle_error(websocket,CIO_PROTOCOL_NOT_SUPPORTED,CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR,
                     "invalid status code in close");
        return;
      }
      reason._7_1_ = reason._7_1_ - 2;
    }
    if (reason._7_1_ != 0) {
      cio_utf8_init((cio_utf8_state *)((long)&reason + 2));
      uVar2 = cio_check_utf8((cio_utf8_state *)((long)&reason + 2),puStack_18 + 2,
                             (long)(int)(reason._7_1_ - 2));
      if (uVar2 != '\0') {
        handle_error(websocket,CIO_PROTOCOL_NOT_SUPPORTED,CIO_WEBSOCKET_CLOSE_UNSUPPORTED_DATA,
                     "reason in close frame not utf8 valid");
        return;
      }
    }
    if (websocket->on_control !=
        (_func_void_cio_websocket_ptr_cio_websocket_frame_type_uint8_t_ptr_uint_fast8_t *)0x0) {
      (*websocket->on_control)(websocket,CIO_WEBSOCKET_CLOSE_FRAME,puStack_18,reason._6_1_);
    }
    if ((*(ushort *)&(websocket->ws_private).ws_flags >> 9 & 1) == 1) {
      cio_timer_cancel(&(websocket->ws_private).close_timer);
      cio_timer_close(&(websocket->ws_private).close_timer);
      close((int)websocket);
    }
    else {
      if (reason._7_1_ == 0) {
        frame_length = 0;
      }
      else {
        frame_length = (size_t)(puStack_18 + 2);
      }
      prepare_close_job(websocket,(uint)reason._4_2_,(uint8_t *)frame_length,(ulong)reason._7_1_,
                        (cio_websocket_write_handler_t)0x0,(void *)0x0,response_close_frame_written)
      ;
      length_00 = cio_write_buffer_get_total_size((websocket->ws_private).write_close_job.wbh);
      enqueue_job(websocket,&(websocket->ws_private).write_close_job,length_00);
    }
  }
  return;
}

Assistant:

static void handle_close_frame(struct cio_websocket *websocket, const uint8_t *data, uint_fast8_t length)
{
	uint_fast8_t len = length;

	if (cio_unlikely(length == 1)) {
		handle_error(websocket, CIO_PROTOCOL_NOT_SUPPORTED, CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR, "close payload of length 1");
		return;
	}

	uint16_t status_code = CIO_WEBSOCKET_CLOSE_NORMAL;
	if (length >= 2) {
		memcpy(&status_code, data, sizeof(status_code));
		status_code = cio_be16toh(status_code);
		if (cio_unlikely(is_invalid_status_code(status_code))) {
			handle_error(websocket, CIO_PROTOCOL_NOT_SUPPORTED, CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR, "invalid status code in close");
			return;
		}

		length = (uint_fast8_t)(length - sizeof(status_code));
	}

	if (length > 0) {
		struct cio_utf8_state state;
		cio_utf8_init(&state);
		if (cio_unlikely(cio_check_utf8(&state, data + 2, (size_t)(length - 2)) != CIO_UTF8_ACCEPT)) {
			handle_error(websocket, CIO_PROTOCOL_NOT_SUPPORTED, CIO_WEBSOCKET_CLOSE_UNSUPPORTED_DATA, "reason in close frame not utf8 valid");
			return;
		}
	}

	if (websocket->on_control != NULL) {
		websocket->on_control(websocket, CIO_WEBSOCKET_CLOSE_FRAME, data, len);
	}

	if (websocket->ws_private.ws_flags.self_initiated_close == 1U) {
		cio_timer_cancel(&websocket->ws_private.close_timer);
		cio_timer_close(&websocket->ws_private.close_timer);
		close(websocket);
	} else {
		const uint8_t *reason = NULL;
		if (length > 0) {
			reason = data + sizeof(status_code);
		} else {
			reason = NULL;
		}

		prepare_close_job(websocket, status_code, reason, length, NULL, NULL, response_close_frame_written);
		size_t frame_length = cio_write_buffer_get_total_size(websocket->ws_private.write_close_job.wbh);
		enqueue_job(websocket, &websocket->ws_private.write_close_job, frame_length);
	}
}